

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

void __thiscall chrono::ChCoordsys<double>::SetIdentity(ChCoordsys<double> *this)

{
  ChQuaternion<double> local_20;
  
  (this->pos).m_data[2] = 0.0;
  (this->pos).m_data[0] = 0.0;
  (this->pos).m_data[1] = 0.0;
  local_20.m_data[0] = 1.0;
  local_20.m_data[3] = 0.0;
  local_20.m_data[1] = 0.0;
  local_20.m_data[2] = 0.0;
  ChQuaternion<double>::operator=(&this->rot,&local_20);
  return;
}

Assistant:

void SetIdentity() {
        pos = ChVector<Real>(0, 0, 0);
        rot = ChQuaternion<Real>(1, 0, 0, 0);
    }